

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O3

int fy_fetch_value(fy_parser *fyp,int c)

{
  fy_token_list *fytl;
  uint uVar1;
  uint uVar2;
  list_head *plVar3;
  list_head *plVar4;
  list_head *plVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  list_head *first;
  fy_token *pfVar10;
  fy_atom *pfVar11;
  fy_atom *pfVar12;
  int iVar13;
  undefined8 uVar14;
  list_head *last;
  uint *handle;
  fy_atom *pfVar15;
  char *pcVar16;
  fy_input *pfVar17;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  fy_simple_key *_n;
  byte bVar21;
  ushort uVar22;
  size_t sVar23;
  undefined1 local_108 [8];
  undefined8 uStack_100;
  char *pcStack_f8;
  fy_input *pfStack_f0;
  char *pcStack_e8;
  fy_input *pfStack_e0;
  char *pcStack_d8;
  code *pcStack_d0;
  undefined1 local_c8 [16];
  size_t local_b8;
  char *pcStack_b0;
  size_t local_a8;
  size_t local_90;
  undefined1 local_88 [8];
  fy_token_list sk_tl;
  ulong local_60;
  fy_input *local_58;
  fy_token *local_50;
  ulong local_48;
  _Bool local_3d;
  undefined4 local_3c;
  char cStack_38;
  _Bool did_purge;
  char local_32;
  byte local_31;
  
  handle = (uint *)local_c8;
  if (c == 0x3a) {
    if (fyp == (fy_parser *)0x0) {
      sVar23 = 0;
      uVar19 = 0;
      pfVar17 = (fy_input *)0x0;
LAB_0012f792:
      local_88 = (undefined1  [8])local_88;
      sk_tl._lh.next = (list_head *)local_88;
      if ((fyp->flow_level == 0) || (fyp->indent < fyp->column)) {
        pcStack_d0 = (code *)0x12f7bf;
        iVar9 = fy_purge_stale_simple_keys(fyp,&local_3d,FYTT_VALUE);
        if (iVar9 != 0) {
          pcVar16 = "fy_purge_stale_simple_keys() failed";
          _n = (fy_simple_key *)0x0;
          iVar9 = 0x7e3;
          handle = (uint *)local_c8;
          goto LAB_0012f7ec;
        }
        _n = (fy_simple_key *)(fyp->simple_keys)._lh.next;
        pcStack_d8 = (char *)(ulong)(uint)fyp->flow_level;
        if ((_n == (fy_simple_key *)0x0 || _n == (fy_simple_key *)&fyp->simple_keys) ||
           (_n->flow_level != fyp->flow_level)) {
          uVar14 = 0x7ed;
          pfStack_e0 = (fy_input *)0x12f93a;
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x7ed,"fy_fetch_value","no simple key flow_level=%d");
          _cStack_38 = (undefined4)CONCAT71((int7)((ulong)uVar14 >> 8),1);
          if ((fyp->queued_tokens)._lh.next == &(fyp->queued_tokens)._lh) {
            local_50 = (fy_token *)0x0;
          }
          else {
            local_50 = (fy_token *)(fyp->queued_tokens)._lh.prev;
          }
          _n = (fy_simple_key *)0x0;
          local_60 = uVar19;
          local_58 = pfVar17;
        }
        else {
          plVar3 = (_n->node).next;
          plVar4 = (_n->node).prev;
          plVar3->prev = plVar4;
          plVar4->next = plVar3;
          (_n->node).next = (list_head *)_n;
          (_n->node).prev = (list_head *)_n;
          if ((_n->field_0x3c & 2) == 0) {
            pcStack_d0 = fy_fetch_anchor_or_alias;
            __assert_fail("fysk->possible",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                          ,0x7f3,"int fy_fetch_value(struct fy_parser *, int)");
          }
          local_50 = _n->token;
          sVar23 = (_n->mark).input_pos;
          uVar1 = (_n->mark).line;
          pfVar17 = (fy_input *)(ulong)(uint)(_n->mark).column;
          uVar19 = (ulong)(uint)(_n->end_mark).line;
          uVar2 = (_n->end_mark).column;
          _cStack_38 = 0;
          pfStack_e0 = (fy_input *)0x12f8ff;
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x7f9,"fy_fetch_value","have simple key flow_level=%d");
          local_60 = (ulong)uVar1;
          local_58 = (fy_input *)(ulong)uVar2;
        }
        pcStack_e8 = (char *)(ulong)(uint)fyp->flow_level;
        pcStack_d8 = (char *)(ulong)(uint)fyp->indent;
        pfStack_f0 = (fy_input *)0x12fa43;
        pfStack_e0 = pfVar17;
        fy_parser_diag(fyp,0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,0x7fd,"fy_fetch_value","flow_level=%d, column=%d parse_indent=%d");
        iVar9 = fyp->pending_complex_key_column;
        iVar18 = (int)uVar19;
        iVar13 = (int)pfVar17;
        if (iVar9 < 0) {
          local_48 = (ulong)(uint)fyp->line;
          bVar20 = fyp->line <= iVar18;
          bVar21 = (fyp->field_0x70 & 0x20) >> 5;
          bVar8 = 1;
          bVar6 = false;
          local_3c = 0;
          bVar7 = false;
          if (fyp->flow_level == 0) goto LAB_0012fae2;
LAB_0012faf5:
          if ((-1 < iVar9) || (local_31 = 1, bVar8 == 0)) goto LAB_0012fb0b;
        }
        else {
          if (fyp->flow_level == 0) {
            local_48 = (ulong)(uint)fyp->line;
            bVar20 = fyp->line <= iVar18;
            bVar21 = (fyp->field_0x70 & 0x20) >> 5;
            bVar7 = fyp->column <= (fyp->pending_complex_key_mark).column;
LAB_0012fae2:
            bVar6 = bVar7;
            local_3c = (undefined4)CONCAT71((int7)((ulong)pfVar17 >> 8),fyp->indent < iVar13);
            bVar8 = bVar21;
            goto LAB_0012faf5;
          }
          local_48 = (ulong)(uint)fyp->line;
          bVar20 = fyp->line <= iVar18;
          bVar21 = (fyp->field_0x70 & 0x20) >> 5;
          bVar6 = true;
          local_3c = 0;
LAB_0012fb0b:
          local_31 = (bVar6 ^ 1U) & -1 < iVar9;
        }
        pcStack_d8 = (char *)local_48;
        pfStack_e0 = local_58;
        pcStack_f8 = (char *)local_60;
        uStack_100._0_4_ = 0x12fb62;
        uStack_100._4_4_ = 0;
        pfStack_f0 = pfVar17;
        pcStack_e8 = (char *)uVar19;
        local_90 = sVar23;
        sk_tl._lh.prev._4_4_ = iVar9;
        local_32 = bVar20;
        fy_parser_diag(fyp,0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,0x80a,"fy_fetch_value",
                       "mark_insert.line=%d/%d mark_end_insert.line=%d/%d fyp->line=%d");
        pcStack_d8 = "true";
        local_108 = (undefined1  [8])0x148d0f;
        if ((*(ushort *)&fyp->field_0x70 & 8) == 0) {
          local_108 = (undefined1  [8])0x14a373;
        }
        uStack_100 = "false";
        if (-1 < iVar9) {
          uStack_100 = "true";
        }
        pcStack_f8 = "true";
        if (!bVar6) {
          pcStack_f8 = "false";
        }
        pfStack_f0 = (fy_input *)0x148d0f;
        if (bVar20 != false) {
          pfStack_f0 = (fy_input *)0x14a373;
        }
        pcStack_e8 = "true";
        if (bVar21 == 0) {
          pcStack_e8 = "false";
        }
        pfStack_e0 = (fy_input *)0x148d0f;
        if ((char)local_3c == '\0') {
          pfStack_e0 = (fy_input *)0x14a373;
        }
        if (local_31 == 0) {
          pcStack_d8 = "false";
        }
        pfVar11 = (fy_atom *)local_108;
        fy_parser_diag(fyp,0x20,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,0x814,"fy_fetch_value",
                       "simple_key_allowed=%s is_complex=%s final_complex_key=%s is_multiline=%s has_bmap=%s push_bmap_start=%s push_key_only=%s"
                      );
        pfVar15 = (fy_atom *)local_c8;
        handle = (uint *)local_c8;
        pfVar12 = (fy_atom *)local_c8;
        if (((sk_tl._lh.prev._4_4_ < 0) && (local_32 == '\0')) &&
           ((fyp->flow_level == 0 || (fyp->flow != FYFT_MAP)))) {
          local_b8 = 0;
          pcStack_b0 = (char *)0x0;
          local_a8 = 0;
          local_c8._0_8_ = 0x200000004;
          pfVar12 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_108);
          local_c8._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar12);
          fy_parser_diag_report
                    (fyp,(fy_diag_report_ctx *)local_c8,"Illegal placement of \':\' indicator");
          iVar9 = -1;
          goto LAB_0012f9d9;
        }
        if ((char)local_3c == '\0') {
          if (local_31 != 0) {
LAB_0012fda0:
            pfVar12 = (fy_atom *)local_108;
            pfVar11 = fy_fill_atom(fyp,0,pfVar12);
            pfVar10 = fy_token_queue_internal(fyp,(fy_token_list *)local_88,FYTT_KEY,pfVar11);
            pfVar15 = pfVar12;
            if (pfVar10 == (fy_token *)0x0) {
              pcVar16 = "fy_token_queue_internal() failed";
              iVar13 = 0x835;
              goto LAB_0013009c;
            }
          }
          *(undefined8 *)&pfVar15[-1].increment = 0x12fde6;
          fyp_debug_dump_token(fyp,local_50,"insert-token: ");
          fytl = &fyp->queued_tokens;
          *(undefined8 *)&pfVar15[-1].increment = 0x12fe02;
          fyp_debug_dump_token_list(fyp,fytl,local_50,"fyp->queued_tokens (before): ");
          *(undefined8 *)&pfVar15[-1].increment = 0x12fe1a;
          fyp_debug_dump_token_list(fyp,(fy_token_list *)local_88,(fy_token *)0x0,"sk_tl: ");
          plVar3 = sk_tl._lh.next;
          if (local_50 == (fy_token *)0x0) {
            if (local_88 != (undefined1  [8])local_88) {
              plVar4 = (fytl->_lh).next;
              *(fy_token_list **)((long)local_88 + 8) = fytl;
              (fytl->_lh).next = (list_head *)local_88;
              plVar3->next = plVar4;
              plVar4->prev = plVar3;
            }
            uVar22 = 0;
            *(undefined8 *)&pfVar15[-1].increment = 0x12fe8e;
            fyp_debug_dump_token_list(fyp,fytl,(fy_token *)0x0,"fyp->queued_tokens (after): ");
            if (cStack_38 != '\0') goto LAB_0012fe94;
          }
          else if (cStack_38 == '\0') {
            if (local_88 != (undefined1  [8])local_88) {
              plVar4 = (local_50->node).prev;
              plVar5 = plVar4->next;
              *(list_head **)((long)local_88 + 8) = plVar4;
              plVar4->next = (list_head *)local_88;
              plVar3->next = plVar5;
              plVar5->prev = plVar3;
            }
            *(undefined8 *)&pfVar15[-1].increment = 0x12fed8;
            fyp_debug_dump_token_list(fyp,fytl,local_50,"fyp->queued_tokens (after): ");
            uVar22 = 0;
          }
          else {
            if (local_88 != (undefined1  [8])local_88) {
              plVar4 = (local_50->node).next;
              *(fy_token **)((long)local_88 + 8) = local_50;
              (local_50->node).next = (list_head *)local_88;
              plVar3->next = plVar4;
              plVar4->prev = plVar3;
            }
            *(undefined8 *)&pfVar15[-1].increment = 0x12fe59;
            fyp_debug_dump_token_list(fyp,fytl,local_50,"fyp->queued_tokens (after): ");
LAB_0012fe94:
            uVar22 = (ushort)(fyp->flow_level == 0) << 3;
          }
          handle = &pfVar15[-2].increment;
          pfVar15[-2].fyi = (fy_input *)0x12fef0;
          pfVar12 = fy_fill_atom(fyp,1,(fy_atom *)handle);
          pfVar15[-2].fyi = (fy_input *)0x12ff05;
          pfVar10 = fy_token_queue(fyp,FYTT_VALUE,pfVar12);
          if (pfVar10 != (fy_token *)0x0) {
            *(ushort *)&fyp->field_0x70 = (ushort)*(undefined4 *)&fyp->field_0x70 & 0xfff7 | uVar22;
            pcVar16 = "true";
            if (uVar22 == 0) {
              pcVar16 = "false";
            }
            pfVar15[-2].storage_hint = (size_t)pcVar16;
            pfVar15[-2].end_mark.line = 0x12ff62;
            pfVar15[-2].end_mark.column = 0;
            fy_parser_diag(fyp,0x20,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                           ,0x84f,"fy_fetch_value","simple_key_allowed -> %s\n");
            if (cStack_38 == '\0') {
              pfVar15[-2].fyi = (fy_input *)0x12ff77;
              fy_parse_simple_key_recycle(fyp,_n);
            }
            if (bVar6) {
              fyp->pending_complex_key_column = -1;
              pfVar15[-2].storage_hint = 0xffffffff;
              pfVar15[-2].end_mark.line = 0x12ffb6;
              pfVar15[-2].end_mark.column = 0;
              fy_parser_diag(fyp,0x20,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                             ,0x857,"fy_fetch_value","pending_complex_key_column -> %d");
            }
            if (local_50 == (fy_token *)0x0) {
              return 0;
            }
            while( true ) {
              pfVar15[-2].fyi = (fy_input *)0x12ffd5;
              iVar9 = fy_parse_peek_at_offset(fyp,0);
              if ((iVar9 != 9) && (iVar9 != 0x20)) break;
              pfVar15[-2].fyi = (fy_input *)0x12ffcb;
              fy_advance(fyp,iVar9);
            }
            if (iVar9 != 0x23) {
              return 0;
            }
            pfVar15[-2].fyi = (fy_input *)0x12fffb;
            iVar9 = fy_scan_comment(fyp,local_50->comment + 1,false);
            if (iVar9 == 0) {
              return 0;
            }
            pcVar16 = "fy_scan_comment() failed";
            iVar9 = 0x863;
            goto LAB_0012f7ec;
          }
          pcVar16 = "fy_token_queue() failed";
          iVar13 = 0x84c;
          pfVar12 = (fy_atom *)handle;
        }
        else {
          if (fyp->flow_level != 0) {
            pcStack_d0 = (code *)0x1300c7;
            __assert_fail("!fyp->flow_level",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                          ,0x81d,"int fy_fetch_value(struct fy_parser *, int)");
          }
          pcStack_d0 = (code *)0x12fc68;
          fy_parser_diag(fyp,0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                         ,0x81f,"fy_fetch_value","--- parse_roll");
          pcStack_d0 = (code *)0x12fc7c;
          iVar9 = fy_push_indent(fyp,iVar13,true);
          if (iVar9 != 0) {
            pcVar16 = "fy_push_indent() failed";
            iVar9 = 0x824;
            goto LAB_0012f7ec;
          }
          pcStack_d0 = (code *)0x12fd45;
          fy_fill_atom_start(fyp,(fy_atom *)local_c8);
          pcStack_d0 = (code *)0x12fd50;
          fy_fill_atom_end(fyp,(fy_atom *)local_c8);
          local_b8 = local_90;
          pcStack_b0 = (char *)CONCAT44(iVar13,(int)local_60);
          local_c8._0_8_ = local_90;
          local_c8._8_8_ = CONCAT44(iVar13,(int)local_60);
          pcStack_d0 = (code *)0x12fd97;
          pfVar10 = fy_token_queue_internal
                              (fyp,(fy_token_list *)local_88,FYTT_BLOCK_MAPPING_START,
                               (fy_atom *)local_c8);
          if (pfVar10 != (fy_token *)0x0) goto LAB_0012fda0;
          pcVar16 = "fy_token_queue_internal() failed";
          iVar13 = 0x82e;
        }
LAB_0013009c:
        iVar9 = 0;
        *(undefined8 *)&pfVar12[-1].increment = 0x1300a3;
        fy_parser_diag(fyp,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                       ,iVar13,"fy_fetch_value",pcVar16);
        pfVar11 = pfVar12;
        goto LAB_0012f9d9;
      }
      local_b8 = 0;
      pcStack_b0 = (char *)0x0;
      local_a8 = 0;
      local_c8._0_8_ = 0x200000004;
      pfVar12 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_108);
      local_c8._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar12);
      pcVar16 = "wrongly indented mapping value in flow mode";
    }
    else {
      if (((fyp->current_input == (fy_input *)0x0) || ((fyp->current_input->field_0x74 & 1) == 0))
         || (fyp->flow == FYFT_MAP)) {
        sVar23 = fyp->current_input_pos;
        uVar19 = (ulong)(uint)fyp->line;
        pfVar17 = (fy_input *)(ulong)(uint)fyp->column;
        goto LAB_0012f792;
      }
      local_b8 = 0;
      pcStack_b0 = (char *)0x0;
      local_a8 = 0;
      local_c8._0_8_ = 0x200000004;
      pfVar12 = fy_fill_atom_at(fyp,0,1,(fy_atom *)local_108);
      local_c8._8_8_ = fy_token_create(FYTT_INPUT_MARKER,pfVar12);
      pcVar16 = "JSON considers keys when not in mapping context invalid";
    }
    handle = (uint *)local_108;
    _n = (fy_simple_key *)0x0;
    fy_parser_diag_report(fyp,(fy_diag_report_ctx *)local_c8,pcVar16);
  }
  else {
    pcVar16 = "illegal value mark";
    _n = (fy_simple_key *)0x0;
    iVar9 = 0x7d3;
LAB_0012f7ec:
    *(undefined8 *)(handle + -2) = 0x12f7f3;
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-parse.c"
                   ,iVar9,"fy_fetch_value",pcVar16);
  }
  iVar9 = -1;
  pfVar11 = (fy_atom *)handle;
LAB_0012f9d9:
  *(undefined8 *)((long)pfVar11 + -8) = 0x12f9e4;
  fy_parse_simple_key_recycle(fyp,_n);
  return iVar9;
}

Assistant:

int fy_fetch_value(struct fy_parser *fyp, int c) {
    struct fy_token_list sk_tl;
    struct fy_simple_key *fysk = NULL;
    struct fy_mark mark, mark_insert, mark_end_insert;
    struct fy_token *fyt_insert, *fyt;
    struct fy_atom handle;
    bool target_simple_key_allowed, is_complex, has_bmap;
    bool push_bmap_start, push_key_only, did_purge, final_complex_key;
    bool is_multiline __FY_DEBUG_UNUSED__;
    int rc;

    fyp_error_check(fyp, c == ':', err_out,
                    "illegal value mark");

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp_json_mode(fyp) || fyp->flow == FYFT_MAP, err_out,
                          "JSON considers keys when not in mapping context invalid");

    fy_get_mark(fyp, &mark);

    fy_token_list_init(&sk_tl);

    FYP_PARSE_ERROR_CHECK(fyp, 0, 1, FYEM_SCAN,
                          !fyp->flow_level || fyp->column > fyp->indent, err_out,
                          "wrongly indented mapping value in flow mode");

    rc = fy_purge_stale_simple_keys(fyp, &did_purge, FYTT_VALUE);
    fyp_error_check(fyp, !rc, err_out_rc,
                    "fy_purge_stale_simple_keys() failed");

    /* get the simple key (if available) for the value */
    fysk = fy_simple_key_list_head(&fyp->simple_keys);
    if (fysk && fysk->flow_level == fyp->flow_level)
        fy_simple_key_list_del(&fyp->simple_keys, fysk);
    else
        fysk = NULL;

    if (!fysk) {
        fyp_scan_debug(fyp, "no simple key flow_level=%d", fyp->flow_level);

        fyt_insert = fy_token_list_tail(&fyp->queued_tokens);
        mark_insert = mark;
        mark_end_insert = mark;
    } else {
        assert(fysk->possible);
        assert(fysk->flow_level == fyp->flow_level);
        fyt_insert = fysk->token;
        mark_insert = fysk->mark;
        mark_end_insert = fysk->end_mark;

        fyp_scan_debug(fyp, "have simple key flow_level=%d", fyp->flow_level);
    }

    fyp_scan_debug(fyp, "flow_level=%d, column=%d parse_indent=%d",
                   fyp->flow_level, mark_insert.column, fyp->indent);

    is_complex = fyp->pending_complex_key_column >= 0;
    final_complex_key = is_complex && (fyp->flow_level || fyp->column <= fyp->pending_complex_key_mark.column);
    is_multiline = mark_end_insert.line < fyp->line;
    has_bmap = fyp->generated_block_map;
    push_bmap_start = (!fyp->flow_level && mark_insert.column > fyp->indent);
    push_key_only = (!is_complex && (fyp->flow_level || has_bmap)) ||
                    (is_complex && !final_complex_key);

    fyp_scan_debug(fyp, "mark_insert.line=%d/%d mark_end_insert.line=%d/%d fyp->line=%d",
                   mark_insert.line, mark_insert.column,
                   mark_end_insert.line, mark_end_insert.column,
                   fyp->line);

    fyp_scan_debug(fyp,
                   "simple_key_allowed=%s is_complex=%s final_complex_key=%s is_multiline=%s has_bmap=%s push_bmap_start=%s push_key_only=%s",
                   fyp->simple_key_allowed ? "true" : "false",
                   is_complex ? "true" : "false",
                   final_complex_key ? "true" : "false",
                   is_multiline ? "true" : "false",
                   has_bmap ? "true" : "false",
                   push_bmap_start ? "true" : "false",
                   push_key_only ? "true" : "false");

    if (!is_complex && is_multiline && (!fyp->flow_level || fyp->flow != FYFT_MAP)) {
        FYP_PARSE_ERROR(fyp, 0, 1, FYEM_SCAN, "Illegal placement of ':' indicator");
        goto err_out;
    }

    if (push_bmap_start) {

        assert(!fyp->flow_level);

        fyp_scan_debug(fyp, "--- parse_roll");

        /* push the new indent level */
        rc = fy_push_indent(fyp, mark_insert.column, true);
        fyp_error_check(fyp, !rc, err_out_rc,
                        "fy_push_indent() failed");

        fy_fill_atom_start(fyp, &handle);
        fy_fill_atom_end(fyp, &handle);

        handle.start_mark = handle.end_mark = mark_insert;

        /* and the block mapping start */
        fyt = fy_token_queue_internal(fyp, &sk_tl, FYTT_BLOCK_MAPPING_START, &handle);
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");
    }

    if (push_bmap_start || push_key_only) {

        fyt = fy_token_queue_internal(fyp, &sk_tl, FYTT_KEY, fy_fill_atom_a(fyp, 0));
        fyp_error_check(fyp, fyt, err_out_rc,
                        "fy_token_queue_internal() failed");

    }

    fyp_debug_dump_token(fyp, fyt_insert, "insert-token: ");
    fyp_debug_dump_token_list(fyp, &fyp->queued_tokens, fyt_insert, "fyp->queued_tokens (before): ");
    fyp_debug_dump_token_list(fyp, &sk_tl, NULL, "sk_tl: ");

    if (fyt_insert) {

        if (fysk)
            fy_token_list_splice_before(&fyp->queued_tokens, fyt_insert, &sk_tl);
        else
            fy_token_list_splice_after(&fyp->queued_tokens, fyt_insert, &sk_tl);
    } else
        fy_token_lists_splice(&fyp->queued_tokens, &sk_tl);

    fyp_debug_dump_token_list(fyp, &fyp->queued_tokens, fyt_insert, "fyp->queued_tokens (after): ");

    target_simple_key_allowed = fysk ? false : !fyp->flow_level;

    fyt = fy_token_queue(fyp, FYTT_VALUE, fy_fill_atom_a(fyp, 1));
    fyp_error_check(fyp, fyt, err_out_rc,
                    "fy_token_queue() failed");

    fyp->simple_key_allowed = target_simple_key_allowed;
    fyp_scan_debug(fyp, "simple_key_allowed -> %s\n", fyp->simple_key_allowed ? "true" : "false");

    if (fysk)
        fy_parse_simple_key_recycle(fyp, fysk);

    if (final_complex_key) {
        fyp->pending_complex_key_column = -1;
        fyp_scan_debug(fyp, "pending_complex_key_column -> %d",
                       fyp->pending_complex_key_column);
    }

    if (fyt_insert) {
        /* eat whitespace */
        while (fy_is_blank(c = fy_parse_peek(fyp)))
            fy_advance(fyp, c);

        /* comment? */
        if (c == '#') {
            rc = fy_scan_comment(fyp, &fyt_insert->comment[fycp_right], false);
            fyp_error_check(fyp, !rc, err_out_rc,
                            "fy_scan_comment() failed");
        }
    }

    return 0;

    err_out:
    rc = -1;
    err_out_rc:
    fy_parse_simple_key_recycle(fyp, fysk);
    return rc;
}